

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaVErrFull(xmlSchemaValidCtxtPtr ctxt,xmlNodePtr node,int code,xmlErrorLevel level,
                      char *file,int line,xmlChar *str1,xmlChar *str2,xmlChar *str3,int col,
                      char *msg,...)

{
  xmlStructuredErrorFunc schannel;
  char in_AL;
  int iVar1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlGenericErrorFunc channel;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  long lStack_120;
  va_list ap;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (ctxt->err != 2) {
    if (level == XML_ERR_WARNING) {
      lStack_120 = 0x18;
    }
    else {
      ctxt->nberrors = ctxt->nberrors + 1;
      ctxt->err = code;
      lStack_120 = 0x10;
    }
    schannel = ctxt->serror;
    channel = *(xmlGenericErrorFunc *)((long)&ctxt->type + lStack_120);
    if (schannel == (xmlStructuredErrorFunc)0x0 && channel == (xmlGenericErrorFunc)0x0) {
      pp_Var2 = __xmlGenericError();
      channel = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
    }
    else {
      ppvVar3 = &ctxt->errCtxt;
    }
    ap[0].reg_save_area = local_e8;
    ap[0].overflow_arg_area = &stack0x00000030;
    ap[0].gp_offset = 0x30;
    ap[0].fp_offset = 0x30;
    iVar1 = xmlVRaiseError(schannel,channel,*ppvVar3,ctxt,node,0x11,code,level,file,line,
                           (char *)str1,(char *)str2,(char *)str3,0,col,msg,ap);
    if (iVar1 < 0) {
      xmlSchemaVErrMemory(ctxt);
    }
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(11,12)
xmlSchemaVErrFull(xmlSchemaValidCtxtPtr ctxt, xmlNodePtr node, int code,
                  xmlErrorLevel level, const char *file, int line,
                  const xmlChar *str1, const xmlChar *str2, const xmlChar *str3,
                  int col, const char *msg, ...) {
    xmlGenericErrorFunc channel = NULL;
    xmlStructuredErrorFunc schannel = NULL;
    void *data = NULL;
    int res;
    va_list ap;

    if (ctxt != NULL) {
        /* Don't overwrite memory errors */
        if (ctxt->err == XML_ERR_NO_MEMORY)
            return;

        if (level == XML_ERR_WARNING) {
            channel = ctxt->warning;
        } else {
            ctxt->nberrors++;
            ctxt->err = code;
            channel = ctxt->error;
        }
        data = ctxt->errCtxt;
        schannel = ctxt->serror;
    }